

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Neuron_testWatchFor_Test::~Neuron_testWatchFor_Test(Neuron_testWatchFor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Neuron, testWatchFor)
{
    Neuron n1, n2, n3;
    std::vector<Neuron*> b1 = {&n2, &n3};
    n1.watchFor(b1);

    std::vector<Neuron*> b2 = {&n3};
    n1.watchFor(b2);

    EXPECT_FALSE(n1.watchForSpiked());

    n1.tick(TIME_STEP);
    EXPECT_FALSE(n1.watchForSpiked());

    n2.tick(TIME_STEP);
    n3.tick(TIME_STEP);
    EXPECT_FALSE(n1.watchForSpiked());

    n1.tick(TIME_STEP);
    n2.spike();
    EXPECT_TRUE(n2.tick(TIME_STEP));
    n3.tick(TIME_STEP);
    EXPECT_FALSE(n1.watchForSpiked());

    for (int i = 0; i < 14; ++i) {
        EXPECT_FALSE(n1.tick(TIME_STEP));
        EXPECT_FALSE(n2.tick(TIME_STEP));
        EXPECT_FALSE(n3.tick(TIME_STEP));
    }

    EXPECT_FALSE(n2.firing());
    EXPECT_FALSE(n3.firing());

    n2.spike();
    n3.spike();

    EXPECT_FALSE(n1.tick(TIME_STEP));
    EXPECT_TRUE(n2.tick(TIME_STEP));
    EXPECT_TRUE(n3.tick(TIME_STEP));
    EXPECT_TRUE(n1.watchForSpiked());
}